

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O1

void BrotliStoreMetaBlockTrivial
               (MemoryManager *m,uint8_t *input,size_t start_pos,size_t length,size_t mask,
               int is_last,BrotliEncoderParams *params,Command *commands,size_t n_commands,
               size_t *storage_ix,uint8_t *storage)

{
  ulong uVar1;
  uint uVar2;
  HuffmanTree *tree;
  ulong uVar3;
  uint8_t lit_depth [256];
  uint8_t dist_depth [140];
  uint16_t lit_bits [256];
  uint16_t dist_bits [140];
  HistogramLiteral local_2028;
  uint8_t cmd_depth [704];
  uint16_t cmd_bits [704];
  HistogramDistance local_13d0;
  HistogramCommand local_b40;
  
  uVar2 = (params->dist).alphabet_size;
  StoreCompressedMetaBlockHeader(is_last,length,storage_ix,storage);
  memset(&local_2028,0,0x408);
  local_2028.bit_cost_ = INFINITY;
  memset(&local_b40,0,0xb08);
  local_b40.bit_cost_ = INFINITY;
  memset(&local_13d0,0,0x888);
  local_13d0.bit_cost_ = INFINITY;
  BuildHistograms(input,start_pos,mask,commands,n_commands,&local_2028,&local_b40,&local_13d0);
  uVar1 = *storage_ix;
  uVar3 = uVar1 >> 3;
  *(ulong *)(storage + uVar3) = (ulong)storage[uVar3];
  *storage_ix = uVar1 + 0xd;
  tree = (HuffmanTree *)BrotliAllocate(m,0x2c08);
  BuildAndStoreHuffmanTree(local_2028.data_,0x100,0x100,tree,lit_depth,lit_bits,storage_ix,storage);
  BuildAndStoreHuffmanTree(local_b40.data_,0x2c0,0x2c0,tree,cmd_depth,cmd_bits,storage_ix,storage);
  BuildAndStoreHuffmanTree
            (local_13d0.data_,0x8c,(ulong)uVar2,tree,dist_depth,dist_bits,storage_ix,storage);
  BrotliFree(m,tree);
  StoreDataWithHuffmanCodes
            (input,start_pos,mask,commands,n_commands,lit_depth,lit_bits,cmd_depth,cmd_bits,
             dist_depth,dist_bits,storage_ix,storage);
  if (is_last != 0) {
    uVar2 = (int)*storage_ix + 7;
    *storage_ix = (ulong)(uVar2 & 0xfffffff8);
    storage[uVar2 >> 3] = '\0';
  }
  return;
}

Assistant:

void BrotliStoreMetaBlockTrivial(MemoryManager* m,
    const uint8_t* input, size_t start_pos, size_t length, size_t mask,
    BROTLI_BOOL is_last, const BrotliEncoderParams* params,
    const Command* commands, size_t n_commands,
    size_t* storage_ix, uint8_t* storage) {
  HistogramLiteral lit_histo;
  HistogramCommand cmd_histo;
  HistogramDistance dist_histo;
  uint8_t lit_depth[BROTLI_NUM_LITERAL_SYMBOLS];
  uint16_t lit_bits[BROTLI_NUM_LITERAL_SYMBOLS];
  uint8_t cmd_depth[BROTLI_NUM_COMMAND_SYMBOLS];
  uint16_t cmd_bits[BROTLI_NUM_COMMAND_SYMBOLS];
  uint8_t dist_depth[MAX_SIMPLE_DISTANCE_ALPHABET_SIZE];
  uint16_t dist_bits[MAX_SIMPLE_DISTANCE_ALPHABET_SIZE];
  HuffmanTree* tree;
  uint32_t num_distance_symbols = params->dist.alphabet_size;

  StoreCompressedMetaBlockHeader(is_last, length, storage_ix, storage);

  HistogramClearLiteral(&lit_histo);
  HistogramClearCommand(&cmd_histo);
  HistogramClearDistance(&dist_histo);

  BuildHistograms(input, start_pos, mask, commands, n_commands,
                  &lit_histo, &cmd_histo, &dist_histo);

  BrotliWriteBits(13, 0, storage_ix, storage);

  tree = BROTLI_ALLOC(m, HuffmanTree, MAX_HUFFMAN_TREE_SIZE);
  if (BROTLI_IS_OOM(m)) return;
  BuildAndStoreHuffmanTree(lit_histo.data_, BROTLI_NUM_LITERAL_SYMBOLS,
                           BROTLI_NUM_LITERAL_SYMBOLS, tree,
                           lit_depth, lit_bits,
                           storage_ix, storage);
  BuildAndStoreHuffmanTree(cmd_histo.data_, BROTLI_NUM_COMMAND_SYMBOLS,
                           BROTLI_NUM_COMMAND_SYMBOLS, tree,
                           cmd_depth, cmd_bits,
                           storage_ix, storage);
  BuildAndStoreHuffmanTree(dist_histo.data_, MAX_SIMPLE_DISTANCE_ALPHABET_SIZE,
                           num_distance_symbols, tree,
                           dist_depth, dist_bits,
                           storage_ix, storage);
  BROTLI_FREE(m, tree);
  StoreDataWithHuffmanCodes(input, start_pos, mask, commands,
                            n_commands, lit_depth, lit_bits,
                            cmd_depth, cmd_bits,
                            dist_depth, dist_bits,
                            storage_ix, storage);
  if (is_last) {
    JumpToByteBoundary(storage_ix, storage);
  }
}